

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexSeparableFilter::applyToCornerFace
          (PtexSeparableFilter *this,PtexSeparableKernel *k,FaceInfo *f,int eid,int cfid,
          FaceInfo *cf,int ceid)

{
  byte bVar1;
  
  bVar1 = cf->flags;
  if ((f->flags & 8) >> 3 != (bVar1 & 8) >> 3) {
    if ((bVar1 & 8) == 0) {
      PtexSeparableKernel::adjustSubfaceToMain(k,eid + 3);
    }
    else {
      PtexSeparableKernel::adjustMainToSubface(k,eid + 3);
    }
  }
  PtexSeparableKernel::rotate(k,(eid - ceid) + 2);
  if ((bVar1 & 8) != 0) {
    splitAndApply(this,k,cfid,cf);
    return;
  }
  apply(this,k,cfid,cf);
  return;
}

Assistant:

void PtexSeparableFilter::applyToCornerFace(PtexSeparableKernel& k, const Ptex::FaceInfo& f, int eid,
                                            int cfid, const Ptex::FaceInfo& cf, int ceid)
{
    // adjust uv coord and res for face/subface boundary
    bool fIsSubface = f.isSubface(), cfIsSubface = cf.isSubface();
    if (fIsSubface != cfIsSubface) {
        if (cfIsSubface) k.adjustMainToSubface(eid + 3);
        else k.adjustSubfaceToMain(eid + 3);
    }

    // rotate and apply (resplit if going to a subface)
    k.rotate(eid - ceid + 2);
    if (cfIsSubface) splitAndApply(k, cfid, cf);
    else apply(k, cfid, cf);
}